

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::BringWindowToFocusFront(ImGuiWindow *window)

{
  ImGuiContext *pIVar1;
  ImGuiWindow **ppIVar2;
  ImGuiWindow **__src;
  ImGuiWindow *in_RDI;
  int i;
  ImGuiContext *g;
  undefined8 in_stack_ffffffffffffffd8;
  int iVar3;
  ImVector<ImGuiWindow_*> *in_stack_ffffffffffffffe0;
  int local_14;
  
  pIVar1 = GImGui;
  ppIVar2 = ImVector<ImGuiWindow_*>::back(in_stack_ffffffffffffffe0);
  if (*ppIVar2 != in_RDI) {
    for (local_14 = (pIVar1->WindowsFocusOrder).Size + -2; -1 < local_14; local_14 = local_14 + -1)
    {
      iVar3 = (int)((ulong)in_stack_ffffffffffffffd8 >> 0x20);
      ppIVar2 = ImVector<ImGuiWindow_*>::operator[](in_stack_ffffffffffffffe0,iVar3);
      if (*ppIVar2 == in_RDI) {
        ppIVar2 = ImVector<ImGuiWindow_*>::operator[](in_stack_ffffffffffffffe0,iVar3);
        iVar3 = (int)((ulong)ppIVar2 >> 0x20);
        __src = ImVector<ImGuiWindow_*>::operator[](in_stack_ffffffffffffffe0,iVar3);
        memmove(ppIVar2,__src,(long)(((pIVar1->WindowsFocusOrder).Size - local_14) + -1) << 3);
        ppIVar2 = ImVector<ImGuiWindow_*>::operator[]((ImVector<ImGuiWindow_*> *)in_RDI,iVar3);
        *ppIVar2 = in_RDI;
        return;
      }
    }
  }
  return;
}

Assistant:

void ImGui::BringWindowToFocusFront(ImGuiWindow* window)
{
    ImGuiContext& g = *GImGui;
    if (g.WindowsFocusOrder.back() == window)
        return;
    for (int i = g.WindowsFocusOrder.Size - 2; i >= 0; i--) // We can ignore the top-most window
        if (g.WindowsFocusOrder[i] == window)
        {
            memmove(&g.WindowsFocusOrder[i], &g.WindowsFocusOrder[i + 1], (size_t)(g.WindowsFocusOrder.Size - i - 1) * sizeof(ImGuiWindow*));
            g.WindowsFocusOrder[g.WindowsFocusOrder.Size - 1] = window;
            break;
        }
}